

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PeleLM.cpp
# Opt level: O0

void __thiscall PeleLM::state_stats(PeleLM *this,MultiFab *S)

{
  initializer_list<const_amrex::MultiFab_*> iVar1;
  initializer_list<const_amrex::MultiFab_*> iVar2;
  bool bVar3;
  bool bVar4;
  Print *this_00;
  Print *this_01;
  double *pdVar5;
  Print *this_02;
  undefined8 in_RSI;
  int idx;
  int i_1;
  Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  names;
  int i;
  bool aNegY;
  Vector<double,_std::allocator<double>_> scaleMax;
  Vector<double,_std::allocator<double>_> scaleMin;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff4f8;
  Print *in_stack_fffffffffffff500;
  iterator in_stack_fffffffffffff508;
  size_type in_stack_fffffffffffff510;
  ostream *in_stack_fffffffffffff528;
  Print *in_stack_fffffffffffff530;
  Print *in_stack_fffffffffffff570;
  undefined8 in_stack_fffffffffffff578;
  IntVect *in_stack_fffffffffffff580;
  Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>
  *in_stack_fffffffffffff588;
  int local_714;
  int local_c0;
  undefined8 local_b8;
  undefined8 *local_b0;
  undefined8 local_a8;
  undefined1 local_58 [8];
  undefined1 *local_50;
  undefined8 local_48;
  undefined8 local_10;
  
  if (1 < NavierStokesBase::verbose) {
    local_50 = local_58;
    local_48 = 1;
    local_10 = in_RSI;
    std::allocator<const_amrex::MultiFab_*>::allocator
              ((allocator<const_amrex::MultiFab_*> *)0x50df88);
    iVar1._M_len = in_stack_fffffffffffff510;
    iVar1._M_array = in_stack_fffffffffffff508;
    amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
              ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff500,iVar1,(allocator_type *)in_stack_fffffffffffff4f8);
    amrex::VectorMin(in_stack_fffffffffffff588,in_stack_fffffffffffff580,
                     (int)((ulong)in_stack_fffffffffffff578 >> 0x20),(int)in_stack_fffffffffffff578,
                     (int)((ulong)in_stack_fffffffffffff570 >> 0x20));
    amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::~Vector
              ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)0x50dff0
              );
    std::allocator<const_amrex::MultiFab_*>::~allocator
              ((allocator<const_amrex::MultiFab_*> *)0x50dffd);
    local_b8 = local_10;
    local_b0 = &local_b8;
    local_a8 = 1;
    std::allocator<const_amrex::MultiFab_*>::allocator
              ((allocator<const_amrex::MultiFab_*> *)0x50e03e);
    iVar2._M_len = in_stack_fffffffffffff510;
    iVar2._M_array = in_stack_fffffffffffff508;
    amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::vector
              ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)
               in_stack_fffffffffffff500,iVar2,(allocator_type *)in_stack_fffffffffffff4f8);
    amrex::VectorMax(in_stack_fffffffffffff588,in_stack_fffffffffffff580,
                     (int)((ulong)in_stack_fffffffffffff578 >> 0x20),(int)in_stack_fffffffffffff578,
                     (int)((ulong)in_stack_fffffffffffff570 >> 0x20));
    amrex::Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_>::~Vector
              ((Vector<const_amrex::MultiFab_*,_std::allocator<const_amrex::MultiFab_*>_> *)0x50e0a6
              );
    std::allocator<const_amrex::MultiFab_*>::~allocator
              ((allocator<const_amrex::MultiFab_*> *)0x50e0b3);
    bVar4 = false;
    local_c0 = 0;
    while( true ) {
      bVar3 = false;
      if (local_c0 < 0x15) {
        bVar3 = (bool)(bVar4 ^ 1);
      }
      if (!bVar3) break;
      pdVar5 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                         ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff500,
                          (size_type)in_stack_fffffffffffff4f8);
      if (*pdVar5 <= 0.0 && *pdVar5 != 0.0) {
        bVar4 = true;
      }
      local_c0 = local_c0 + 1;
    }
    amrex::OutStream();
    amrex::Print::Print(in_stack_fffffffffffff530,in_stack_fffffffffffff528);
    amrex::Print::operator<<(in_stack_fffffffffffff500,(char (*) [26])in_stack_fffffffffffff4f8);
    amrex::Vector<double,_std::allocator<double>_>::operator[]
              ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff500,
               (size_type)in_stack_fffffffffffff4f8);
    amrex::Print::operator<<(in_stack_fffffffffffff500,(double *)in_stack_fffffffffffff4f8);
    amrex::Print::operator<<(in_stack_fffffffffffff500,(char (*) [3])in_stack_fffffffffffff4f8);
    amrex::Vector<double,_std::allocator<double>_>::operator[]
              ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff500,
               (size_type)in_stack_fffffffffffff4f8);
    amrex::Print::operator<<(in_stack_fffffffffffff500,(double *)in_stack_fffffffffffff4f8);
    amrex::Print::operator<<(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8);
    amrex::Print::~Print(in_stack_fffffffffffff570);
    amrex::OutStream();
    amrex::Print::Print(in_stack_fffffffffffff530,in_stack_fffffffffffff528);
    amrex::Print::operator<<(in_stack_fffffffffffff500,(char (*) [26])in_stack_fffffffffffff4f8);
    amrex::Vector<double,_std::allocator<double>_>::operator[]
              ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff500,
               (size_type)in_stack_fffffffffffff4f8);
    amrex::Print::operator<<(in_stack_fffffffffffff500,(double *)in_stack_fffffffffffff4f8);
    this_00 = amrex::Print::operator<<
                        (in_stack_fffffffffffff500,(char (*) [3])in_stack_fffffffffffff4f8);
    amrex::Vector<double,_std::allocator<double>_>::operator[]
              ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff500,
               (size_type)in_stack_fffffffffffff4f8);
    amrex::Print::operator<<(in_stack_fffffffffffff500,(double *)in_stack_fffffffffffff4f8);
    amrex::Print::operator<<(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8);
    amrex::Print::~Print(this_00);
    amrex::OutStream();
    amrex::Print::Print(in_stack_fffffffffffff530,in_stack_fffffffffffff528);
    amrex::Print::operator<<(in_stack_fffffffffffff500,(char (*) [26])in_stack_fffffffffffff4f8);
    amrex::Vector<double,_std::allocator<double>_>::operator[]
              ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff500,
               (size_type)in_stack_fffffffffffff4f8);
    amrex::Print::operator<<(in_stack_fffffffffffff500,(double *)in_stack_fffffffffffff4f8);
    amrex::Print::operator<<(in_stack_fffffffffffff500,(char (*) [3])in_stack_fffffffffffff4f8);
    amrex::Vector<double,_std::allocator<double>_>::operator[]
              ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff500,
               (size_type)in_stack_fffffffffffff4f8);
    amrex::Print::operator<<(in_stack_fffffffffffff500,(double *)in_stack_fffffffffffff4f8);
    amrex::Print::operator<<(in_stack_fffffffffffff500,(char *)in_stack_fffffffffffff4f8);
    amrex::Print::~Print(this_00);
    if (bVar4) {
      amrex::
      Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)0x50e4a5);
      pele::physics::eos::speciesNames<pele::physics::eos::Fuego>
                ((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)0x50e4af);
      this_01 = (Print *)amrex::OutStream();
      amrex::Print::Print(this_01,in_stack_fffffffffffff528);
      amrex::Print::operator<<(in_stack_fffffffffffff500,(char (*) [22])in_stack_fffffffffffff4f8);
      amrex::Print::~Print(this_00);
      for (local_714 = 0; local_714 < 0x15; local_714 = local_714 + 1) {
        pdVar5 = amrex::Vector<double,_std::allocator<double>_>::operator[]
                           ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff500,
                            (size_type)in_stack_fffffffffffff4f8);
        if (*pdVar5 <= 0.0 && *pdVar5 != 0.0) {
          in_stack_fffffffffffff528 = amrex::OutStream();
          amrex::Print::Print(this_01,in_stack_fffffffffffff528);
          amrex::Print::operator<<
                    (in_stack_fffffffffffff500,(char (*) [3])in_stack_fffffffffffff4f8);
          amrex::
          Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ::operator[]((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)in_stack_fffffffffffff500,(size_type)in_stack_fffffffffffff4f8);
          amrex::Print::operator<<(in_stack_fffffffffffff500,in_stack_fffffffffffff4f8);
          amrex::Print::operator<<
                    (in_stack_fffffffffffff500,(char (*) [4])in_stack_fffffffffffff4f8);
          amrex::Vector<double,_std::allocator<double>_>::operator[]
                    ((Vector<double,_std::allocator<double>_> *)in_stack_fffffffffffff500,
                     (size_type)in_stack_fffffffffffff4f8);
          amrex::Print::operator<<(in_stack_fffffffffffff500,(double *)in_stack_fffffffffffff4f8);
          amrex::Print::operator<<
                    (in_stack_fffffffffffff500,(char (*) [4])in_stack_fffffffffffff4f8);
          amrex::Print::~Print(this_00);
        }
      }
      this_02 = (Print *)amrex::OutStream();
      amrex::Print::Print(this_01,in_stack_fffffffffffff528);
      amrex::Print::operator<<(this_02,(char *)in_stack_fffffffffffff4f8);
      amrex::Print::~Print(this_00);
      amrex::
      Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~Vector((Vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)0x50e771);
    }
    amrex::Vector<double,_std::allocator<double>_>::~Vector
              ((Vector<double,_std::allocator<double>_> *)0x50e7b0);
    amrex::Vector<double,_std::allocator<double>_>::~Vector
              ((Vector<double,_std::allocator<double>_> *)0x50e7bd);
  }
  return;
}

Assistant:

void
PeleLM::state_stats (MultiFab& S)
{
   BL_PROFILE("PLM::state_stats()");
   if (verbose > 1) {
      //
      // Calculate some minimums and maximums.
      //
      auto scaleMin = VectorMin({&S},FabArrayBase::mfiter_tile_size,Density,NUM_STATE-AMREX_SPACEDIM,0);
      auto scaleMax = VectorMax({&S},FabArrayBase::mfiter_tile_size,Density,NUM_STATE-AMREX_SPACEDIM,0);

      bool aNegY = false;
      for (int i = 0; i < NUM_SPECIES && !aNegY; ++i) {
         if (scaleMin[first_spec+i-AMREX_SPACEDIM] < 0) aNegY = true;
      }

      amrex::Print() << "      |-> Min,max temp = " << scaleMin[Temp   - AMREX_SPACEDIM]
                     << ", "                << scaleMax[Temp   - AMREX_SPACEDIM] << '\n';
      amrex::Print() << "      |-> Min,max rho  = " << scaleMin[Density- AMREX_SPACEDIM]
                     << ", "                << scaleMax[Density- AMREX_SPACEDIM] << '\n';
      amrex::Print() << "      |-> Min,max rhoh = " << scaleMin[RhoH   - AMREX_SPACEDIM]
                     << ", "                << scaleMax[RhoH   - AMREX_SPACEDIM] << '\n';

      if (aNegY){
         Vector<std::string> names;
         pele::physics::eos::speciesNames<pele::physics::PhysicsType::eos_type>(names);
         amrex::Print() << "  Species w/min < 0: ";
         for (int i = 0; i < NUM_SPECIES; ++i) {
            int idx = first_spec + i - AMREX_SPACEDIM;
            if ( scaleMin[idx] < 0) {
               amrex::Print() << "Y(" << names[i] << ") [" << scaleMin[idx] << "]  ";
            }
         }
         amrex::Print() << '\n';
      }
   }
}